

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::ReadV1_TCODE_RH_POINT
          (ON_BinaryArchive *this,ON_Object **ppObject,ON_3dmObjectAttributes *pAttributes)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  ON_3DM_BIG_CHUNK *pOVar4;
  ON_OBSOLETE_V2_AnnotationArrow *this_00;
  ON_3DM_BIG_CHUNK *pOVar5;
  ON_3dPoint *this_01;
  ON_3DM_BIG_CHUNK *pOVar6;
  double dVar7;
  bool bHaveMat;
  ON_3dPoint pt;
  ON__3dmV1_XDATA xdata;
  bool local_91;
  ON_Object **local_90;
  ON_3dPoint local_88;
  ON__3dmV1_XDATA local_70;
  ON_3dPoint local_48;
  
  lVar3 = (long)(this->m_chunk).m_count;
  pOVar6 = (ON_3DM_BIG_CHUNK *)0x0;
  pOVar4 = (this->m_chunk).m_a + lVar3 + -1;
  if (lVar3 < 1) {
    pOVar4 = pOVar6;
  }
  pOVar5 = (ON_3DM_BIG_CHUNK *)0x0;
  if ((pOVar4 != (ON_3DM_BIG_CHUNK *)0x0) &&
     (pOVar6 = (ON_3DM_BIG_CHUNK *)0x0, pOVar4->m_typecode == 0x100001)) {
    pOVar6 = (ON_3DM_BIG_CHUNK *)0x0;
    pOVar5 = (ON_3DM_BIG_CHUNK *)0x0;
    if (pOVar4->m_big_value == 0) {
      pOVar6 = (ON_3DM_BIG_CHUNK *)this->m_current_positionX;
      pOVar5 = pOVar4;
    }
  }
  local_91 = false;
  local_90 = ppObject;
  ON_String::ON_String(&local_70.m_string);
  bVar1 = ReadDouble(this,3,&local_88.x);
  if (bVar1) {
    bVar1 = Read3dmV1AttributesOrMaterial
                      (this,pAttributes,(ON_Material *)0x0,&local_91,0xffffffff,&local_70);
    if (local_70.m_type == arrow_direction) {
      dVar7 = ON_3dVector::Length(&local_70.m_vector);
      if (dVar7 <= 2.3283064365386963e-10) {
        this_00 = (ON_OBSOLETE_V2_AnnotationArrow *)operator_new(0x28);
        ON_Point::ON_Point((ON_Point *)this_00,&local_88);
      }
      else {
        this_00 = (ON_OBSOLETE_V2_AnnotationArrow *)operator_new(0x40);
        ON_OBSOLETE_V2_AnnotationArrow::ON_OBSOLETE_V2_AnnotationArrow(this_00);
        (this_00->m_tail).z = local_88.z;
        (this_00->m_tail).x = local_88.x;
        (this_00->m_tail).y = local_88.y;
        ON_3dPoint::operator+(&local_48,&local_88,&local_70.m_vector);
        (this_00->m_head).z = local_48.z;
        (this_00->m_head).x = local_48.x;
        (this_00->m_head).y = local_48.y;
      }
    }
    else if (local_70.m_type == dot_text) {
      this_00 = (ON_OBSOLETE_V2_AnnotationArrow *)operator_new(0x30);
      ON_OBSOLETE_V2_TextDot::ON_OBSOLETE_V2_TextDot((ON_OBSOLETE_V2_TextDot *)this_00);
      (this_00->m_tail).z = local_88.z;
      (this_00->m_tail).x = local_88.x;
      (this_00->m_tail).y = local_88.y;
      this_01 = &this_00->m_head;
      ON_wString::operator=((ON_wString *)this_01,&local_70.m_string);
      bVar2 = ON_wString::IsEmpty((ON_wString *)this_01);
      if (bVar2) {
        ON_wString::operator=((ON_wString *)this_01," ");
      }
    }
    else {
      this_00 = (ON_OBSOLETE_V2_AnnotationArrow *)operator_new(0x28);
      ON_Point::ON_Point((ON_Point *)this_00,&local_88);
    }
    *local_90 = (ON_Object *)this_00;
  }
  if (((pOVar5 != (ON_3DM_BIG_CHUNK *)0x0 && pOVar6 != (ON_3DM_BIG_CHUNK *)0x0) & bVar1) == 1) {
    lVar3 = (long)(this->m_chunk).m_count;
    pOVar4 = (ON_3DM_BIG_CHUNK *)0x0;
    if (0 < lVar3) {
      pOVar4 = (this->m_chunk).m_a + lVar3 + -1;
    }
    if (((pOVar5 == pOVar4) && (pOVar5->m_typecode == 0x100001)) && (pOVar5->m_big_value == 0)) {
      lVar3 = 0;
      if (pOVar6 <= (ON_3DM_BIG_CHUNK *)this->m_current_positionX) {
        lVar3 = (long)this->m_current_positionX - (long)pOVar6;
      }
      if (lVar3 - 0x20U < 0xfffffdf) {
        pOVar5->m_big_value = lVar3;
      }
    }
  }
  ON_String::~ON_String(&local_70.m_string);
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::ReadV1_TCODE_RH_POINT(
  ON_Object** ppObject,
  ON_3dmObjectAttributes* pAttributes
  )
{
  ON__UINT64 pos0 = 0;
  ON_3DM_BIG_CHUNK* point_chunk = m_chunk.Last();

  if (    0 != point_chunk 
       && TCODE_RH_POINT == point_chunk->m_typecode 
       && 0 == point_chunk->m_big_value )
  {
    // Some early V1 files have TCODE_RH_POINT chunks with arrow xdata
    // attached have a length set to zero.
    // For these chunks we need to set the chunk length so EndRead3dmChunk()
    // will keep going.
    pos0 = CurrentPosition();
  }
  else
    point_chunk = 0;

  // read v1 point
  bool rc = false;
  bool bHaveMat = false;
  ON_3dPoint pt;
  ON__3dmV1_XDATA xdata;
  rc = ReadPoint(pt);
  if (rc) 
  {
    rc = Read3dmV1AttributesOrMaterial(pAttributes,nullptr,bHaveMat,TCODE_ENDOFTABLE,&xdata);
    // do switch even if Read3dmV1AttributesOrMaterial() fails
    switch ( xdata.m_type )
    {
    case ON__3dmV1_XDATA::arrow_direction:
      if ( xdata.m_vector.Length() > ON_ZERO_TOLERANCE )
      {
        ON_OBSOLETE_V2_AnnotationArrow* arrow = new ON_OBSOLETE_V2_AnnotationArrow();
        arrow->m_tail = pt;
        arrow->m_head = pt + xdata.m_vector;
        *ppObject = arrow;
      }
      else
      {
        *ppObject = new ON_Point(pt);
      }
      break;

    case ON__3dmV1_XDATA::dot_text:
      {
        ON_OBSOLETE_V2_TextDot* dot = new ON_OBSOLETE_V2_TextDot();
        dot->point = pt;
        dot->m_text = xdata.m_string;
        if ( dot->m_text.IsEmpty() )
          dot->m_text = " "; // a single blank
        *ppObject = dot;
      }
      break;

    default:
      *ppObject = new ON_Point(pt);
      break;
    }
  }

  // carefully test for the V1 zero length chunk bug
  if ( rc && pos0 > 0 && 0 != point_chunk && point_chunk == m_chunk.Last() )
  {
    if ( TCODE_RH_POINT == point_chunk->m_typecode && 0 == point_chunk->m_big_value )
    {
      // This TCODE_RH_POINT chunk has the zero length chunk bug
      // that was in some V1 files. 
      // Fill in the correct chunk length so that reading can continue.
      ON__UINT64 pos1 = CurrentPosition();
      ON__UINT64 chunk_length = (pos1 > pos0) ? (pos1 - pos0) : 0;
      if ( chunk_length >= 32 && chunk_length < 0x0FFFFFFF )
        point_chunk->m_big_value = (ON__INT64)chunk_length;
    }
  }

  return rc;
}